

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

EStatusCode __thiscall
AbstractContentContext::TfLow(AbstractContentContext *this,string *inFontName,double inFontSize)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GraphicState *pGVar3;
  string local_48;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var,iVar2),&KProcsetPDF_abi_cxx11_);
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var_00,iVar2),&KProcsetText_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteName(this_00,inFontName,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inFontSize,eTokenSeparatorSpace);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Tf","");
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  std::__cxx11::string::_M_assign((string *)&pGVar3->mPlacedFontName);
  pGVar3 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  pGVar3->mPlacedFontSize = inFontSize;
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::TfLow(const std::string& inFontName,double inFontSize)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.WriteName(inFontName);
	mPrimitiveWriter.WriteDouble(inFontSize);
	mPrimitiveWriter.WriteKeyword("Tf");

	mGraphicStack.GetCurrentState().mPlacedFontName = inFontName;
	mGraphicStack.GetCurrentState().mPlacedFontSize = inFontSize;
	return GetCurrentStatusCode();
}